

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall Dinic_BenchmarkV100E10000_Test::TestBody(Dinic_BenchmarkV100E10000_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined1 local_a0 [8];
  Dinic d;
  
  srand(1);
  Dinic::Dinic((Dinic *)local_a0,100);
  iVar4 = 30000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    Dinic::addEdge((Dinic *)local_a0,iVar1 % 100,iVar2 % 100,(ulong)(iVar3 % 1000 + 1000));
  }
  Dinic::getFlow((Dinic *)local_a0,0,99);
  Dinic::~Dinic((Dinic *)local_a0);
  return;
}

Assistant:

TEST(Dinic, BenchmarkV100E10000) {
    srand(1);
    int n = 100;
    int m = 30000;
    int range = 1000;
    Dinic d(n);
    rep(i, 0, m) {
        d.addEdge(rand() % n, rand() % n, range + rand() % range);
    }
    d.getFlow(0, n - 1);
}